

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

shared_ptr<pstore::broker::scavenger> __thiscall
pstore::broker::command_processor::atomic_weak_ptr<pstore::broker::scavenger>::get
          (atomic_weak_ptr<pstore::broker::scavenger> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  mutex_type *in_RSI;
  shared_ptr<pstore::broker::scavenger> sVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  atomic_weak_ptr<pstore::broker::scavenger> *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&local_20,in_RSI);
  std::weak_ptr<pstore::broker::scavenger>::lock((weak_ptr<pstore::broker::scavenger> *)this);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  sVar1.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstore::broker::scavenger>)
         sVar1.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> get () {
                    std::lock_guard<decltype (mut_)> const lock{mut_};
                    return ptr_.lock ();
                }